

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

iterator * __thiscall
tcb::unicode::detail::
unicode_view<std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>,_std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>,_wchar_t,_char16_t>
::iterator::operator++(iterator *this)

{
  byte bVar1;
  int_type iVar2;
  int_type iVar3;
  
  bVar1 = this->idx_ + 1;
  this->idx_ = bVar1;
  if ((this->next_chars_).size_ == (uint)bVar1) {
    iVar2 = std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::_M_get(&this->first_);
    iVar3 = std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::_M_get(&this->last_);
    if ((iVar2 == 0xffffffff) != (iVar3 == 0xffffffff)) {
      unicode_view<std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>,wchar_t,char16_t>
      ::iterator::operator++((iterator *)&this->last_);
    }
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }